

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BuildSystem-C-API.cpp
# Opt level: O2

void __thiscall
anon_unknown.dwarf_214010::CAPIBuildSystemFrontendDelegate::commandProcessHadOutput
          (CAPIBuildSystemFrontendDelegate *this,Command *command,ProcessHandle handle,
          StringRef data)

{
  _func_void_void_ptr_llb_buildsystem_command_t_ptr_llb_buildsystem_process_t_ptr_llb_data_t_ptr
  *p_Var1;
  llb_data_t cData;
  llb_data_t local_10;
  
  local_10.length = data.Length;
  local_10.data = (uint8_t *)data.Data;
  p_Var1 = (this->cAPIDelegate).command_process_had_output;
  if (p_Var1 != (_func_void_void_ptr_llb_buildsystem_command_t_ptr_llb_buildsystem_process_t_ptr_llb_data_t_ptr
                 *)0x0) {
    (*p_Var1)((this->cAPIDelegate).context,(llb_buildsystem_command_t *)command,
              (llb_buildsystem_process_t *)handle.id,&local_10);
  }
  return;
}

Assistant:

virtual void commandProcessHadOutput(Command* command, ProcessHandle handle,
                                       StringRef data) override {
    if (cAPIDelegate.command_process_had_output) {
      llb_data_t cData{ data.size(), (const uint8_t*) data.data() };
      cAPIDelegate.command_process_had_output(
          cAPIDelegate.context,
          (llb_buildsystem_command_t*) command,
          (llb_buildsystem_process_t*) handle.id,
          &cData);
    }
  }